

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

void __thiscall
chaiscript::json::JSON::JSON<std::__cxx11::string>
          (JSON *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s,
          type *param_2)

{
  undefined8 *puVar1;
  pointer pcVar2;
  undefined8 *local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  pcVar2 = (s->_M_dataplus)._M_p;
  local_38 = &local_28;
  std::__cxx11::string::_M_construct<char*>((string *)&local_38,pcVar2,pcVar2 + s->_M_string_length)
  ;
  puVar1 = (undefined8 *)
           ((long)&(this->internal).d.
                   super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
                   .
                   super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
                   .
                   super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
                   .
                   super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
                   .
                   super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           + 0x10);
  *(undefined8 **)
   &(this->internal).d.
    super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
    .
    super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
    .
    super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
    .
    super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
    .
    super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
       = puVar1;
  if (local_38 == &local_28) {
    *puVar1 = local_28;
    *(undefined8 *)
     ((long)&(this->internal).d.
             super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
             .
             super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
             .
             super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
             .
             super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
             .
             super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
     + 0x18) = uStack_20;
  }
  else {
    *(undefined8 **)
     &(this->internal).d.
      super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
      .
      super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
      .
      super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
      .
      super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
      .
      super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
         = local_38;
    *(undefined8 *)
     ((long)&(this->internal).d.
             super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
             .
             super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
             .
             super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
             .
             super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
             .
             super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
     + 0x10) = local_28;
  }
  *(undefined8 *)
   ((long)&(this->internal).d.
           super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
           .
           super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
   + 8) = local_30;
  *(__index_type *)
   ((long)&(this->internal).d.
           super__Variant_base<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::json::JSON,_std::equal_to<void>_>,_std::vector<chaiscript::json::JSON,_std::allocator<chaiscript::json::JSON>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_long,_bool>
           .
           super__Move_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Copy_assign_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Move_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
           .
           super__Copy_ctor_alias<std::nullptr_t,_chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char>,_chaiscript::json::JSON>,_std::vector<chaiscript::json::JSON>,_std::__cxx11::basic_string<char>,_double,_long,_bool>
   + 0x20) = '\x03';
  return;
}

Assistant:

explicit JSON(T s, typename enable_if<is_convertible<T, std::string>::value>::type * = nullptr)
        : internal(static_cast<std::string>(s)) {
    }